

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::StuntDouble::lab2Body(Vector3d *__return_storage_ptr__,StuntDouble *this,Vector3d *v)

{
  Vector<double,_3U> local_80;
  RectMatrix<double,_3U,_3U> local_68;
  
  getA((RotMat3x3d *)&local_68,this);
  operator*(&local_80,&local_68,&v->super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>,&local_80);
  return __return_storage_ptr__;
}

Assistant:

Vector3d lab2Body(const Vector3d& v) { return getA() * v; }